

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.c
# Opt level: O1

uint32_t nsync::nsync_counter_add(nsync_counter c,int32_t delta)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  nsync_dll_list_ pnVar4;
  nsync_dll_element_ *e;
  bool bVar5;
  
  if (delta == 0) {
    return (c->value).super___atomic_base<unsigned_int>._M_i;
  }
  nsync_mu_lock(&c->counter_mu);
  do {
    uVar2 = (c->value).super___atomic_base<unsigned_int>._M_i;
    uVar1 = uVar2 + delta;
    LOCK();
    bVar5 = uVar2 == (c->value).super___atomic_base<unsigned_int>._M_i;
    if (bVar5) {
      (c->value).super___atomic_base<unsigned_int>._M_i = uVar1;
    }
    UNLOCK();
  } while (!bVar5);
  if (delta < 1) {
    if (uVar1 < uVar2) goto LAB_00105da9;
  }
  else {
    if ((uVar2 == 0) && ((c->waited).super___atomic_base<unsigned_int>._M_i != 0)) {
      _DAT_00000000 = 0;
    }
    if (uVar2 < uVar1) goto LAB_00105da9;
  }
  _DAT_00000000 = 0;
LAB_00105da9:
  if (uVar1 == 0) {
    while (e = nsync_dll_first_(c->waiters), e != (nsync_dll_element_ *)0x0) {
      pvVar3 = e->container;
      pnVar4 = nsync_dll_remove_(c->waiters,e);
      c->waiters = pnVar4;
      *(undefined4 *)((long)pvVar3 + 0x20) = 0;
      nsync_mu_semaphore_v(*(nsync_semaphore **)((long)pvVar3 + 0x28));
    }
  }
  nsync_mu_unlock(&c->counter_mu);
  return uVar1;
}

Assistant:

uint32_t nsync_counter_add (nsync_counter c, int32_t delta) {
	uint32_t value;
	IGNORE_RACES_START ();
	if (delta == 0) {
		value = ATM_LOAD_ACQ (&c->value);
	} else {
		nsync_mu_lock (&c->counter_mu);
		do {
			value = ATM_LOAD (&c->value);
		} while (!ATM_CAS_RELACQ (&c->value, value, value+delta));
		value += delta;
		if (delta > 0) {
			/* It's illegal to increase the count from zero if
			   there has been a waiter. */
			ASSERT (value != (uint32_t) delta || !ATM_LOAD (&c->waited));
			ASSERT (value > value - delta); /* Crash on overflow. */
		} else {
			ASSERT (value < value - delta); /* Crash on overflow. */
		}
		if (value == 0) {
			nsync_dll_element_ *p;
			while ((p = nsync_dll_first_ (c->waiters)) != NULL) {
				struct nsync_waiter_s *nw = DLL_NSYNC_WAITER (p);
				c->waiters = nsync_dll_remove_ (c->waiters, p);
				ATM_STORE_REL (&nw->waiting, 0);
				nsync_mu_semaphore_v (nw->sem);
			}
		}
		nsync_mu_unlock (&c->counter_mu);
	}
	IGNORE_RACES_END ();
	return (value);
}